

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O0

Node * __thiscall AvlTree::leftRotate(AvlTree *this,Node *node)

{
  int *piVar1;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Node *local_28;
  Node *T2;
  Node *y;
  Node *node_local;
  AvlTree *this_local;
  
  T2 = node->rightChild;
  local_28 = T2->leftChild;
  T2->leftChild = node;
  node->rightChild = local_28;
  y = node;
  node_local = (Node *)this;
  local_2c = height(this,node->leftChild);
  local_30 = height(this,y->rightChild);
  piVar1 = std::max<int>(&local_2c,&local_30);
  y->height = *piVar1 + 1;
  local_34 = height(this,T2->leftChild);
  local_38 = height(this,T2->rightChild);
  piVar1 = std::max<int>(&local_34,&local_38);
  T2->height = *piVar1 + 1;
  return T2;
}

Assistant:

AvlTree::Node *AvlTree::leftRotate(Node *node) {
    Node *y = node->rightChild;
    Node *T2 = y->leftChild;

    // Perform rotation
    y->leftChild = node;
    node->rightChild = T2;

    //  Update heights
    node->height = std::max(height(node->leftChild), height(node->rightChild)) + 1;
    y->height = std::max(height(y->leftChild), height(y->rightChild)) + 1;

    // Return new root
    return y;
}